

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O3

char * google::protobuf::compiler::java::GetCapitalizedType(FieldDescriptor *field,bool immutable)

{
  Type TVar1;
  char *pcVar2;
  LogMessage *pLVar3;
  LogMessage local_50 [63];
  LogFinisher local_11;
  
  TVar1 = GetType(field);
  if (TVar1 - TYPE_DOUBLE < 0x12) {
    pcVar2 = &DAT_002add58 + *(int *)(&DAT_002add58 + (ulong)(TVar1 - TYPE_DOUBLE) * 4);
  }
  else {
    google::protobuf::internal::LogMessage::LogMessage
              (local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/compiler/java/java_helpers.cc"
               ,0x301);
    pLVar3 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<(local_50,"Can\'t get here.");
    google::protobuf::internal::LogFinisher::operator=(&local_11,pLVar3);
    google::protobuf::internal::LogMessage::~LogMessage(local_50);
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

const char* GetCapitalizedType(const FieldDescriptor* field, bool immutable) {
  switch (GetType(field)) {
    case FieldDescriptor::TYPE_INT32:
      return "Int32";
    case FieldDescriptor::TYPE_UINT32:
      return "UInt32";
    case FieldDescriptor::TYPE_SINT32:
      return "SInt32";
    case FieldDescriptor::TYPE_FIXED32:
      return "Fixed32";
    case FieldDescriptor::TYPE_SFIXED32:
      return "SFixed32";
    case FieldDescriptor::TYPE_INT64:
      return "Int64";
    case FieldDescriptor::TYPE_UINT64:
      return "UInt64";
    case FieldDescriptor::TYPE_SINT64:
      return "SInt64";
    case FieldDescriptor::TYPE_FIXED64:
      return "Fixed64";
    case FieldDescriptor::TYPE_SFIXED64:
      return "SFixed64";
    case FieldDescriptor::TYPE_FLOAT:
      return "Float";
    case FieldDescriptor::TYPE_DOUBLE:
      return "Double";
    case FieldDescriptor::TYPE_BOOL:
      return "Bool";
    case FieldDescriptor::TYPE_STRING:
      return "String";
    case FieldDescriptor::TYPE_BYTES: {
      return "Bytes";
    }
    case FieldDescriptor::TYPE_ENUM:
      return "Enum";
    case FieldDescriptor::TYPE_GROUP:
      return "Group";
    case FieldDescriptor::TYPE_MESSAGE:
      return "Message";

      // No default because we want the compiler to complain if any new
      // types are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return NULL;
}